

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_string_tpl.h
# Opt level: O0

void insert_string(deflate_state *s,uint32_t str,uint32_t count)

{
  ushort uVar1;
  uint32_t uVar2;
  uint uVar3;
  void *pvVar4;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  Pos head;
  uint32_t h;
  uint32_t hm;
  uint32_t val;
  Pos idx;
  uint8_t *strend;
  uint8_t *strstart;
  undefined2 local_22;
  undefined8 local_18;
  
  local_18 = (void *)(*(long *)(in_RDI + 0x58) + (ulong)in_ESI);
  pvVar4 = (void *)((long)local_18 + (ulong)in_EDX);
  local_22 = (ushort)in_ESI;
  for (; local_18 < pvVar4; local_18 = (void *)((long)local_18 + 1)) {
    uVar2 = zng_memread_4(local_18);
    uVar3 = uVar2 * -0x61c8864f >> 0x10;
    uVar1 = *(ushort *)(*(long *)(in_RDI + 0x68) + (ulong)uVar3 * 2);
    if (uVar1 != local_22) {
      *(ushort *)(*(long *)(in_RDI + 0x60) + (ulong)((uint)local_22 & *(uint *)(in_RDI + 0x48)) * 2)
           = uVar1;
      *(ushort *)(*(long *)(in_RDI + 0x68) + (ulong)uVar3 * 2) = local_22;
    }
    local_22 = local_22 + 1;
  }
  return;
}

Assistant:

Z_INTERNAL void INSERT_STRING(deflate_state *const s, uint32_t str, uint32_t count) {
    uint8_t *strstart = s->window + str + HASH_CALC_OFFSET;
    uint8_t *strend = strstart + count;

    for (Pos idx = (Pos)str; strstart < strend; idx++, strstart++) {
        uint32_t val, hm;

        HASH_CALC_VAR_INIT;
        HASH_CALC_READ;
        HASH_CALC(HASH_CALC_VAR, val);
        HASH_CALC_VAR &= HASH_CALC_MASK;
        hm = HASH_CALC_VAR;

        Pos head = s->head[hm];
        if (LIKELY(head != idx)) {
            s->prev[idx & s->w_mask] = head;
            s->head[hm] = idx;
        }
    }
}